

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdownhighlighter.cpp
# Opt level: O3

void __thiscall
MarkdownHighlighter::setHeadingStyles
          (MarkdownHighlighter *this,HighlighterState rule,QRegularExpressionMatch *match,
          int capturedGroup)

{
  int iVar1;
  uint uVar2;
  QTextCharFormat *pQVar3;
  QTextFormat *pQVar4;
  double dVar5;
  QTextCharFormat linkFmt;
  HighlighterState state;
  QTextFormat local_60 [20];
  HighlighterState local_4c;
  anon_union_24_3_e3d07ef4_for_data local_48;
  
  local_4c = QSyntaxHighlighter::currentBlockState();
  pQVar3 = QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
                     (&_formats,&local_4c);
  if (rule == Link) {
    local_48._0_4_ = 0;
    pQVar4 = &QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
                        (&_formats,(HighlighterState *)local_48.data)->super_QTextFormat;
    QTextFormat::QTextFormat(local_60,pQVar4);
    dVar5 = (double)QTextFormat::doubleProperty((int)pQVar3);
    QVariant::QVariant((QVariant *)&local_48,dVar5);
    QTextFormat::setProperty((int)local_60,(QVariant *)0x2001);
    QVariant::~QVariant((QVariant *)&local_48);
    if (capturedGroup == 1) {
      iVar1 = QRegularExpressionMatch::capturedStart((int)match);
      uVar2 = QRegularExpressionMatch::capturedLength((int)match);
      QSyntaxHighlighter::setFormat((int)this,iVar1,(QTextCharFormat *)(ulong)uVar2);
    }
    QTextFormat::~QTextFormat(local_60);
  }
  return;
}

Assistant:

void MarkdownHighlighter::setHeadingStyles(HighlighterState rule,
                                           const QRegularExpressionMatch &match,
                                           const int capturedGroup) {
    auto state = static_cast<HighlighterState>(currentBlockState());
    const QTextCharFormat &f = _formats[state];

    if (rule == HighlighterState::Link) {
        auto linkFmt = _formats[Link];
        linkFmt.setFontPointSize(f.fontPointSize());
        if (capturedGroup == 1) {
            setFormat(match.capturedStart(capturedGroup),
                      match.capturedLength(capturedGroup), linkFmt);
        }
        return;
    }
}